

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

Component __thiscall ftxui::ComponentBase::ActiveChild(ComponentBase *this)

{
  bool bVar1;
  reference pvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  Component CVar4;
  ComponentBase *this_local;
  
  bVar1 = std::
          vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
          ::empty((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                   *)(in_RSI + 8));
  if (bVar1) {
    std::shared_ptr<ftxui::ComponentBase>::shared_ptr
              ((shared_ptr<ftxui::ComponentBase> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pvVar2 = std::
             vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ::front((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                      *)(in_RSI + 8));
    std::shared_ptr<ftxui::ComponentBase>::shared_ptr
              ((shared_ptr<ftxui::ComponentBase> *)this,pvVar2);
    _Var3._M_pi = extraout_RDX_00;
  }
  CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Component)CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component ComponentBase::ActiveChild() {
  return children_.empty() ? nullptr : children_.front();
}